

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game-graphics.cpp
# Opt level: O2

string * Game::Graphics::InputCommandListFooterPrompt_abi_cxx11_(void)

{
  char *pcVar1;
  ostream *poVar2;
  long lVar3;
  string *in_RDI;
  ostringstream str_os;
  ostringstream local_1a8 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  for (lVar3 = 0; lVar3 != 0x18; lVar3 = lVar3 + 8) {
    pcVar1 = *(char **)((long)&DAT_00115d28 + lVar3);
    poVar2 = std::operator<<((ostream *)local_1a8,"  ");
    poVar2 = std::operator<<(poVar2,pcVar1);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string InputCommandListFooterPrompt() {
  constexpr auto sp = "  ";
  const auto input_commands_list_footer_text = {
      "", "Press the keys to start and continue.", "\n"};
  std::ostringstream str_os;
  for (const auto txt : input_commands_list_footer_text) {
    str_os << sp << txt << "\n";
  }
  return str_os.str();
}